

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall I2sAnalyzerSettings::SetSettingsFromInterfaces(I2sAnalyzerSettings *this)

{
  char cVar1;
  bool bVar2;
  double dVar3;
  Channel data_channel;
  Channel frame_channel;
  Channel clock_channel;
  Channel local_38 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(&frame_channel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator==(&clock_channel,&frame_channel);
  Channel::~Channel(&frame_channel);
  if (cVar1 == '\0') {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(&data_channel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar1 = Channel::operator==(&frame_channel,&data_channel);
    Channel::~Channel(&data_channel);
    if (cVar1 == '\0') {
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      cVar1 = Channel::operator==(&data_channel,local_38);
      Channel::~Channel(local_38);
      if ((((cVar1 == '\0') &&
           (cVar1 = Channel::operator==(&clock_channel,&frame_channel), cVar1 == '\0')) &&
          (cVar1 = Channel::operator==(&clock_channel,&data_channel), cVar1 == '\0')) &&
         (cVar1 = Channel::operator==(&frame_channel,&data_channel), cVar1 == '\0')) {
        Channel::operator=(&this->mClockChannel,&clock_channel);
        Channel::operator=(&this->mFrameChannel,&frame_channel);
        Channel::operator=(&this->mDataChannel,&data_channel);
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mShiftOrder = (ShiftOrder)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mDataValidEdge = (EdgeDirection)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mBitsPerWord = (U32)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mWordAlignment = (PcmWordAlignment)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mFrameType = (PcmFrameType)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mBitAlignment = (PcmBitAlignment)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mSigned = (Sign)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mWordSelectInverted = (PcmWordSelectInverted)(long)dVar3;
        AnalyzerSettings::ClearChannels();
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,false);
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
        bVar2 = true;
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
      }
      else {
        AnalyzerSettings::SetErrorText((char *)this);
        bVar2 = false;
      }
      Channel::~Channel(&data_channel);
    }
    else {
      AnalyzerSettings::SetErrorText((char *)this);
      bVar2 = false;
    }
    Channel::~Channel(&frame_channel);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
    bVar2 = false;
  }
  Channel::~Channel(&clock_channel);
  return bVar2;
}

Assistant:

bool I2sAnalyzerSettings::SetSettingsFromInterfaces()
{
    Channel clock_channel = mClockChannelInterface->GetChannel();
    if( clock_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM CLOCK signal" );
        return false;
    }

    Channel frame_channel = mFrameChannelInterface->GetChannel();
    if( frame_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM FRAME signal" );
        return false;
    }

    Channel data_channel = mDataChannelInterface->GetChannel();
    if( data_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM DATA signal" );
        return false;
    }

    if( ( clock_channel == frame_channel ) || ( clock_channel == data_channel ) || ( frame_channel == data_channel ) )
    {
        SetErrorText( "Please select different channels for the I2S/PCM signals" );
        return false;
    }

    mClockChannel = clock_channel;
    mFrameChannel = frame_channel;
    mDataChannel = data_channel;

    mShiftOrder = AnalyzerEnums::ShiftOrder( U32( mShiftOrderInterface->GetNumber() ) );
    mDataValidEdge = AnalyzerEnums::EdgeDirection( U32( mDataValidEdgeInterface->GetNumber() ) );
    mBitsPerWord = U32( mBitsPerWordInterface->GetNumber() );

    mWordAlignment = PcmWordAlignment( U32( mWordAlignmentInterface->GetNumber() ) );
    mFrameType = PcmFrameType( U32( mFrameTypeInterface->GetNumber() ) );
    mBitAlignment = PcmBitAlignment( U32( mBitAlignmentInterface->GetNumber() ) );

    mSigned = AnalyzerEnums::Sign( U32( mSignedInterface->GetNumber() ) );

    mWordSelectInverted = PcmWordSelectInverted( U32( mWordSelectInvertedInterface->GetNumber() ) );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", true );
    AddChannel( mFrameChannel, "PCM FRAME", true );
    AddChannel( mDataChannel, "PCM DATA", true );

    return true;
}